

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::CheckLabelFilterInclude(cmCTestTestHandler *this,cmCTestTestProperties *it)

{
  bool bVar1;
  cmCTestTestProperties *it_local;
  cmCTestTestHandler *this_local;
  
  bVar1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::empty
                    (&this->IncludeLabelRegularExpressions);
  if (!bVar1) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&it->Labels);
    if (bVar1) {
      it->IsInBasedOnREOptions = false;
    }
    else {
      bVar1 = MatchLabelsAgainstFilterRE(&it->Labels,&this->IncludeLabelRegularExpressions);
      if (!bVar1) {
        it->IsInBasedOnREOptions = false;
      }
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::CheckLabelFilterInclude(cmCTestTestProperties& it)
{
  // if not using Labels to filter then return
  if (this->IncludeLabelRegularExpressions.empty()) {
    return;
  }
  // if there are no labels and we are filtering by labels
  // then exclude the test as it does not have the label
  if (it.Labels.empty()) {
    it.IsInBasedOnREOptions = false;
    return;
  }
  // if no match was found, exclude the test
  if (!MatchLabelsAgainstFilterRE(it.Labels,
                                  this->IncludeLabelRegularExpressions)) {
    it.IsInBasedOnREOptions = false;
  }
}